

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O1

int __thiscall
cmCTestScriptHandler::RunConfigurationScript
          (cmCTestScriptHandler *this,string *total_script_arg,bool pscope)

{
  cmCTest *pcVar1;
  cmMakefile *this_00;
  bool bVar2;
  int iVar3;
  rep rVar4;
  ostream *poVar5;
  undefined7 in_register_00000011;
  char cVar6;
  SaveRestoreEnvironment sre;
  ostringstream cmCTestLog_msg;
  long *local_1d0;
  long local_1c0 [2];
  SaveRestoreEnvironment local_1b0;
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [6];
  ios_base local_128 [264];
  
  cmSystemTools::SaveRestoreEnvironment::SaveRestoreEnvironment(&local_1b0);
  rVar4 = std::chrono::_V2::steady_clock::now();
  (this->ScriptStartTime).__d.__r = rVar4;
  if ((int)CONCAT71(in_register_00000011,pscope) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Executing Script: ",0x12);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,(total_script_arg->_M_dataplus)._M_p,
                        total_script_arg->_M_string_length);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                 ,0x1ef,(char *)local_1d0,false);
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0,local_1c0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base(local_128);
    iVar3 = ExecuteScript(this,total_script_arg);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Reading Script: ",0x10)
    ;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,(total_script_arg->_M_dataplus)._M_p,
                        total_script_arg->_M_string_length);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                 ,0x1eb,(char *)local_1d0,false);
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0,local_1c0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base(local_128);
    iVar3 = ReadInScript(this,total_script_arg);
  }
  if (iVar3 != 0) goto LAB_001b7f9b;
  this_00 = (this->Makefile)._M_t.
            super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
            super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
            super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  if (this_00 == (cmMakefile *)0x0) {
LAB_001b7f67:
    cVar6 = '\0';
  }
  else {
    local_198._0_8_ = local_198 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_198,"CTEST_RUN_CURRENT_SCRIPT","");
    bVar2 = cmMakefile::IsOn(this_00,(string *)local_198);
    if (!bVar2) goto LAB_001b7f67;
    cVar6 = this->ShouldRunCurrentScript;
  }
  if ((this_00 != (cmMakefile *)0x0) && ((undefined1 *)local_198._0_8_ != local_198 + 0x10)) {
    operator_delete((void *)local_198._0_8_,local_188[0]._M_allocated_capacity + 1);
  }
  iVar3 = 0;
  if (cVar6 != '\0') {
    iVar3 = RunCurrentScript(this);
  }
LAB_001b7f9b:
  cmSystemTools::SaveRestoreEnvironment::~SaveRestoreEnvironment(&local_1b0);
  return iVar3;
}

Assistant:

int cmCTestScriptHandler::RunConfigurationScript(
  const std::string& total_script_arg, bool pscope)
{
#ifndef CMAKE_BOOTSTRAP
  cmSystemTools::SaveRestoreEnvironment sre;
#endif

  int result;

  this->ScriptStartTime = std::chrono::steady_clock::now();

  // read in the script
  if (pscope) {
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               "Reading Script: " << total_script_arg << std::endl);
    result = this->ReadInScript(total_script_arg);
  } else {
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               "Executing Script: " << total_script_arg << std::endl);
    result = this->ExecuteScript(total_script_arg);
  }
  if (result) {
    return result;
  }

  // only run the current script if we should
  if (this->Makefile && this->Makefile->IsOn("CTEST_RUN_CURRENT_SCRIPT") &&
      this->ShouldRunCurrentScript) {
    return this->RunCurrentScript();
  }
  return result;
}